

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_CommitScopeHelper
          (InterpreterStackFrame *this,PropertyIdArray *propIds)

{
  code *pcVar1;
  bool bVar2;
  ActivationObjectEx *this_00;
  ScriptFunction *this_01;
  ScriptFunction *pSVar3;
  undefined4 *puVar4;
  ActivationObjectEx *pAVar5;
  JavascriptLibrary *this_02;
  RecyclableObject *value;
  uint local_3c;
  uint i;
  Var undef;
  PropertyId firstVarSlot;
  ScriptFunction *func;
  ActivationObjectEx *obj;
  PropertyIdArray *propIds_local;
  InterpreterStackFrame *this_local;
  
  this_00 = VarTo<Js::ActivationObjectEx>(*(Var *)(this + 0x58));
  this_01 = ActivationObjectEx::GetParentFunc(this_00);
  pSVar3 = ActivationObjectEx::GetParentFunc(this_00);
  if (pSVar3 != this_01) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1636,"(obj->GetParentFunc() == func)",
                                "obj->GetParentFunc() == func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pAVar5 = ScriptFunction::GetCachedScope(this_01);
  if (pAVar5 == this_00) {
    local_3c = ActivationObjectEx::GetFirstVarSlot(propIds);
    this_02 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
    value = JavascriptLibraryBase::GetUndefined(&this_02->super_JavascriptLibraryBase);
    for (; local_3c < propIds->count; local_3c = local_3c + 1) {
      DynamicObject::SetSlot
                ((DynamicObject *)this_00,(&propIds[1].count)[local_3c],false,local_3c,value);
    }
    ActivationObjectEx::SetCommit(this_00,true);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_CommitScopeHelper(const PropertyIdArray *propIds)
    {
        ActivationObjectEx *obj = VarTo<ActivationObjectEx>(this->localClosure);
        ScriptFunction *func = obj->GetParentFunc();

        Assert(obj->GetParentFunc() == func);
        if (func->GetCachedScope() == obj)
        {
            PropertyId firstVarSlot = ActivationObjectEx::GetFirstVarSlot(propIds);

            Var undef = scriptContext->GetLibrary()->GetUndefined();

            for (uint i = firstVarSlot; i < propIds->count; i++)
            {
                obj->SetSlot(SetSlotArguments(propIds->elements[i], i, undef));
            }

            obj->SetCommit(true);
        }
    }